

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O1

BLOCK_SIZE av1_select_sb_size(AV1EncoderConfig *oxcf,int width,int height,int number_spatial_layers)

{
  MODE MVar1;
  aom_superblock_size_t aVar2;
  int iVar3;
  BLOCK_SIZE BVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  
  aVar2 = (oxcf->tool_cfg).superblock_size;
  if (aVar2 == AOM_SUPERBLOCK_SIZE_64X64) {
    return BLOCK_64X64;
  }
  if (aVar2 == AOM_SUPERBLOCK_SIZE_128X128) {
LAB_001c2139:
    BVar4 = BLOCK_128X128;
  }
  else {
    MVar1 = oxcf->mode;
    if ((MVar1 == '\x02') && ((byte)((oxcf->q_cfg).deltaq_mode - 3) < 2)) {
      return BLOCK_64X64;
    }
    if (1 < number_spatial_layers) {
      return BLOCK_64X64;
    }
    if ((oxcf->q_cfg).deltaq_mode == '\x06') {
      return BLOCK_64X64;
    }
    if ((oxcf->resize_cfg).resize_mode == '\0') {
      if (MVar1 != '\x01') {
        if ((oxcf->superres_cfg).superres_mode == AOM_SUPERRES_NONE) {
          if (width < height) {
            height = width;
          }
          iVar5 = oxcf->speed;
          if (height < 0x1e1 && 0 < iVar5) {
            return BLOCK_64X64;
          }
          if ((((MVar1 == '\0' && height < 0x439 != height < 0x1e1) && (oxcf->row_mt == true)) &&
              (4 < iVar5)) && (1 < oxcf->max_threads)) {
            return BLOCK_64X64;
          }
          if ((MVar1 == '\x02') && (height < 0x870 && 8 < iVar5)) {
            return BLOCK_64X64;
          }
        }
        goto LAB_001c2139;
      }
      if ((oxcf->tune_cfg).content == AOM_CONTENT_SCREEN) {
        iVar5 = (1 << ((byte)(oxcf->tile_cfg).tile_columns & 0x1f)) <<
                ((byte)(oxcf->tile_cfg).tile_rows & 0x1f);
        if (oxcf->row_mt == true) {
          iVar3 = height;
          if (width < height) {
            iVar3 = width;
          }
          if (((0x2cf < iVar3) && (3 < oxcf->max_threads)) &&
             ((iVar5 <= oxcf->max_threads && ((height * width) / (iVar5 << 0xe) < 0x28)))) {
            return BLOCK_64X64;
          }
        }
        if (width < height) {
          height = width;
        }
        bVar7 = SBORROW4(height,0x2d0);
        bVar6 = height + -0x2d0 < 0;
      }
      else {
        if (width < height) {
          height = width;
        }
        bVar7 = SBORROW4(height,0x2d1);
        bVar6 = height + -0x2d1 < 0;
      }
    }
    else {
      iVar5 = (oxcf->frm_dim_cfg).width;
      iVar3 = (oxcf->frm_dim_cfg).height;
      if (iVar5 < iVar3) {
        iVar3 = iVar5;
      }
      bVar7 = SBORROW4(iVar3,0x2d1);
      bVar6 = iVar3 + -0x2d1 < 0;
    }
    BVar4 = (bVar7 == bVar6) * '\x03' + BLOCK_64X64;
  }
  return BVar4;
}

Assistant:

BLOCK_SIZE av1_select_sb_size(const AV1EncoderConfig *const oxcf, int width,
                              int height, int number_spatial_layers) {
  if (oxcf->tool_cfg.superblock_size == AOM_SUPERBLOCK_SIZE_64X64) {
    return BLOCK_64X64;
  }
  if (oxcf->tool_cfg.superblock_size == AOM_SUPERBLOCK_SIZE_128X128) {
    return BLOCK_128X128;
  }
#if CONFIG_TFLITE
  if (oxcf->q_cfg.deltaq_mode == DELTA_Q_USER_RATING_BASED) return BLOCK_64X64;
#endif
  // Force 64x64 superblock size to increase resolution in perceptual
  // AQ and user rating based modes.
  if (oxcf->mode == ALLINTRA &&
      (oxcf->q_cfg.deltaq_mode == DELTA_Q_PERCEPTUAL_AI ||
       oxcf->q_cfg.deltaq_mode == DELTA_Q_USER_RATING_BASED)) {
    return BLOCK_64X64;
  }
  // Variance Boost only supports 64x64 superblocks.
  if (oxcf->q_cfg.deltaq_mode == DELTA_Q_VARIANCE_BOOST) {
    return BLOCK_64X64;
  }
  assert(oxcf->tool_cfg.superblock_size == AOM_SUPERBLOCK_SIZE_DYNAMIC);

  if (number_spatial_layers > 1) {
    // For spatial layers better selection may be done given the resolutions
    // used across the layers, but for now use 64x64 for spatial layers.
    return BLOCK_64X64;
  } else if (oxcf->resize_cfg.resize_mode != RESIZE_NONE) {
    // Use the configured size (top resolution) for resize.
    return AOMMIN(oxcf->frm_dim_cfg.width, oxcf->frm_dim_cfg.height) > 720
               ? BLOCK_128X128
               : BLOCK_64X64;
  } else if (oxcf->mode == REALTIME) {
    if (oxcf->tune_cfg.content == AOM_CONTENT_SCREEN) {
      const TileConfig *const tile_cfg = &oxcf->tile_cfg;
      const int num_tiles =
          (1 << tile_cfg->tile_columns) * (1 << tile_cfg->tile_rows);
      // For multi-thread encode: if the number of (128x128) superblocks
      // per tile is low use 64X64 superblock.
      if (oxcf->row_mt == 1 && oxcf->max_threads >= 4 &&
          oxcf->max_threads >= num_tiles && AOMMIN(width, height) >= 720 &&
          (width * height) / (128 * 128 * num_tiles) < 40)
        return BLOCK_64X64;
      else
        return AOMMIN(width, height) >= 720 ? BLOCK_128X128 : BLOCK_64X64;
    } else {
      return AOMMIN(width, height) > 720 ? BLOCK_128X128 : BLOCK_64X64;
    }
  }

  // TODO(any): Possibly could improve this with a heuristic.
  // When superres / resize is on, 'cm->width / height' can change between
  // calls, so we don't apply this heuristic there.
  // Things break if superblock size changes between the first pass and second
  // pass encoding, which is why this heuristic is not configured as a
  // speed-feature.
  if (oxcf->superres_cfg.superres_mode == AOM_SUPERRES_NONE &&
      oxcf->resize_cfg.resize_mode == RESIZE_NONE) {
    int is_480p_or_lesser = AOMMIN(width, height) <= 480;
    if (oxcf->speed >= 1 && is_480p_or_lesser) return BLOCK_64X64;

    // For 1080p and lower resolutions, choose SB size adaptively based on
    // resolution and speed level for multi-thread encode.
    int is_1080p_or_lesser = AOMMIN(width, height) <= 1080;
    if (!is_480p_or_lesser && is_1080p_or_lesser && oxcf->mode == GOOD &&
        oxcf->row_mt == 1 && oxcf->max_threads > 1 && oxcf->speed >= 5)
      return BLOCK_64X64;

    // For allintra encode, since the maximum partition size is set to 32X32 for
    // speed>=6, superblock size is set to 64X64 instead of 128X128. This
    // improves the multithread performance due to reduction in top right delay
    // and thread sync wastage. Currently, this setting is selectively enabled
    // only for speed>=9 and resolutions less than 4k since cost update
    // frequency is set to INTERNAL_COST_UPD_OFF in these cases.
    const int is_4k_or_larger = AOMMIN(width, height) >= 2160;
    if (oxcf->mode == ALLINTRA && oxcf->speed >= 9 && !is_4k_or_larger)
      return BLOCK_64X64;
  }
  return BLOCK_128X128;
}